

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_label.cc
# Opt level: O3

void parse_simple_label(parser *param_1,shared_data *sd,void *v,v_array<substring> *words)

{
  float fVar1;
  bool bVar2;
  ostream *poVar3;
  substring *psVar4;
  ulong uVar5;
  ulong uVar6;
  float fVar7;
  
  psVar4 = words->_begin;
  switch((long)words->_end - (long)psVar4 >> 4) {
  case 0:
    break;
  case 1:
    fVar7 = float_of_substring(*psVar4);
    *(float *)v = fVar7;
    break;
  case 2:
    fVar7 = float_of_substring(*psVar4);
    *(float *)v = fVar7;
    fVar7 = float_of_substring(words->_begin[1]);
    *(float *)((long)v + 4) = fVar7;
    break;
  case 3:
    fVar7 = float_of_substring(*psVar4);
    *(float *)v = fVar7;
    fVar7 = float_of_substring(words->_begin[1]);
    *(float *)((long)v + 4) = fVar7;
    fVar7 = float_of_substring(words->_begin[2]);
    *(float *)((long)v + 8) = fVar7;
    break;
  default:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Error: ",7);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," is too many tokens for a simple label: ",0x28);
    psVar4 = words->_begin;
    if (words->_end != psVar4) {
      uVar5 = 0;
      uVar6 = 1;
      do {
        std::ostream::write((char *)&std::cout,(long)psVar4[uVar5].begin);
        psVar4 = words->_begin;
        bVar2 = uVar6 < (ulong)((long)words->_end - (long)psVar4 >> 4);
        uVar5 = uVar6;
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (bVar2);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
  }
  fVar7 = *v;
  if (((fVar7 != 3.4028235e+38) || (NAN(fVar7))) && (sd->is_more_than_two_labels_observed == false))
  {
    fVar1 = sd->first_observed_label;
    if ((fVar1 != 3.4028235e+38) || (NAN(fVar1))) {
      if ((fVar1 != fVar7) || (NAN(fVar1) || NAN(fVar7))) {
        fVar1 = sd->second_observed_label;
        if ((fVar1 != 3.4028235e+38) || (NAN(fVar1))) {
          if ((fVar1 != fVar7) || (NAN(fVar1) || NAN(fVar7))) {
            sd->is_more_than_two_labels_observed = true;
          }
        }
        else {
          sd->second_observed_label = fVar7;
        }
      }
    }
    else {
      sd->first_observed_label = fVar7;
    }
  }
  return;
}

Assistant:

void parse_simple_label(parser*, shared_data* sd, void* v, v_array<substring>& words)
{
  label_data* ld = (label_data*)v;

  switch (words.size())
  {
    case 0:
      break;
    case 1:
      ld->label = float_of_substring(words[0]);
      break;
    case 2:
      ld->label = float_of_substring(words[0]);
      ld->weight = float_of_substring(words[1]);
      break;
    case 3:
      ld->label = float_of_substring(words[0]);
      ld->weight = float_of_substring(words[1]);
      ld->initial = float_of_substring(words[2]);
      break;
    default:
      cout << "Error: " << words.size() << " is too many tokens for a simple label: ";
      for (unsigned int i = 0; i < words.size(); ++i) print_substring(words[i]);
      cout << endl;
  }
  count_label(sd, ld->label);
}